

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_app.cpp
# Opt level: O0

Error * __thiscall
ot::commissioner::CommissionerApp::SetNetworkMasterKey
          (Error *__return_storage_ptr__,CommissionerApp *this,ByteArray *aMasterKey,
          MilliSeconds aDelay)

{
  bool bVar1;
  uint uVar2;
  rep rVar3;
  element_type *peVar4;
  Error *aError;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  basic_string_view<char> bVar5;
  format_args args;
  string_view fmt;
  ErrorCode local_24c;
  Error local_248;
  anon_class_1_0_00000001 local_21a;
  v10 local_219;
  v10 *local_218;
  size_t local_210;
  string local_208;
  Error local_1e8;
  undefined1 local_1b0 [8];
  PendingOperationalDataset pendingDataset;
  ByteArray *aMasterKey_local;
  CommissionerApp *this_local;
  MilliSeconds aDelay_local;
  Error *error;
  undefined1 local_98 [16];
  v10 *local_88;
  ulong local_80;
  v10 *local_78;
  size_t sStack_70;
  string *local_68;
  v10 *local_60;
  v10 **local_58;
  v10 **local_50;
  v10 *local_48;
  size_t sStack_40;
  Error **local_38;
  undefined1 *local_30;
  Error **local_28;
  Error **local_20;
  undefined8 local_18;
  undefined1 *local_10;
  
  pendingDataset.mPendingTimestamp._7_1_ = 0;
  this_local = (CommissionerApp *)aDelay.__r;
  aDelay_local.__r = (rep)__return_storage_ptr__;
  Error::Error(__return_storage_ptr__);
  PendingOperationalDataset::PendingOperationalDataset((PendingOperationalDataset *)local_1b0);
  uVar2 = (*(this->super_CommissionerHandler)._vptr_CommissionerHandler[0xf])();
  if ((uVar2 & 1) == 0) {
    SetNetworkMasterKey::anon_class_1_0_00000001::operator()(&local_21a);
    local_58 = &local_218;
    local_60 = &local_219;
    bVar5 = ::fmt::v10::operator()(local_60);
    local_210 = bVar5.size_;
    local_218 = (v10 *)bVar5.data_;
    ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
    local_68 = &local_208;
    local_78 = local_218;
    sStack_70 = local_210;
    local_50 = &local_78;
    local_88 = local_218;
    local_80 = local_210;
    local_48 = local_88;
    sStack_40 = local_80;
    error = (Error *)::fmt::v10::
                     make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>>();
    local_30 = local_98;
    local_38 = &error;
    local_18 = 0;
    args.field_1.values_ = in_R9.values_;
    args.desc_ = (unsigned_long_long)local_38;
    fmt.size_ = 0;
    fmt.data_ = (char *)local_80;
    local_28 = local_38;
    local_20 = local_38;
    local_10 = local_30;
    ::fmt::v10::vformat_abi_cxx11_(&local_208,local_88,fmt,args);
    Error::Error(&local_1e8,kInvalidState,&local_208);
    Error::operator=(__return_storage_ptr__,&local_1e8);
    Error::~Error(&local_1e8);
    std::__cxx11::string::~string((string *)&local_208);
  }
  else {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               &pendingDataset.super_ActiveOperationalDataset.mMeshLocalPrefix.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,aMasterKey);
    pendingDataset.super_ActiveOperationalDataset.mSecurityPolicy.mFlags.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._0_2_ =
         (ushort)pendingDataset.super_ActiveOperationalDataset.mSecurityPolicy.mFlags.
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage | 0x400;
    rVar3 = std::chrono::duration<long,_std::ratio<1L,_1000L>_>::count
                      ((duration<long,_std::ratio<1L,_1000L>_> *)&this_local);
    pendingDataset.super_ActiveOperationalDataset.mSecurityPolicy.mFlags.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = (undefined4)rVar3;
    pendingDataset.super_ActiveOperationalDataset.mSecurityPolicy.mFlags.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._0_2_ =
         (ushort)pendingDataset.super_ActiveOperationalDataset.mSecurityPolicy.mFlags.
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage | 0x20;
    peVar4 = std::
             __shared_ptr_access<ot::commissioner::Commissioner,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<ot::commissioner::Commissioner,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->mCommissioner);
    (*peVar4->_vptr_Commissioner[0x22])(&local_248,peVar4,local_1b0);
    aError = Error::operator=(__return_storage_ptr__,&local_248);
    local_24c = kNone;
    bVar1 = commissioner::operator!=(aError,&local_24c);
    Error::~Error(&local_248);
    if (!bVar1) {
      MergeDataset(&this->mPendingDataset,(PendingOperationalDataset *)local_1b0);
    }
  }
  pendingDataset.mPendingTimestamp._7_1_ = 1;
  PendingOperationalDataset::~PendingOperationalDataset((PendingOperationalDataset *)local_1b0);
  if ((pendingDataset.mPendingTimestamp._7_1_ & 1) == 0) {
    Error::~Error(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

Error CommissionerApp::SetNetworkMasterKey(const ByteArray &aMasterKey, MilliSeconds aDelay)
{
    Error                     error;
    PendingOperationalDataset pendingDataset;

    VerifyOrExit(IsActive(), error = ERROR_INVALID_STATE("the commissioner is not active"));

    pendingDataset.mNetworkMasterKey = aMasterKey;
    pendingDataset.mPresentFlags |= PendingOperationalDataset::kNetworkMasterKeyBit;

    pendingDataset.mDelayTimer = aDelay.count();
    pendingDataset.mPresentFlags |= PendingOperationalDataset::kDelayTimerBit;

    SuccessOrExit(error = mCommissioner->SetPendingDataset(pendingDataset));

    MergeDataset(mPendingDataset, pendingDataset);

exit:
    return error;
}